

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandQueueVkImpl.cpp
# Opt level: O1

void __thiscall
Diligent::SyncPointVk::SyncPointVk
          (SyncPointVk *this,SoftwareQueueIndex CommandQueueId,Uint32 NumContexts,
          VulkanSyncObjectManager *SyncObjectMngr,VkDevice LogicalDevice,Uint64 dbgValue)

{
  VulkanRecycledSemaphore *pSemaphores;
  ulong uVar1;
  bool bVar2;
  char cVar3;
  undefined8 *puVar4;
  long *plVar5;
  byte bVar6;
  uint uVar7;
  ulong *puVar8;
  size_type *psVar9;
  Uint64 UVar10;
  long lVar11;
  ulong uVar12;
  char cVar13;
  undefined7 in_register_00000031;
  ulong uVar14;
  String Name;
  string __str_2;
  string __str_1;
  string __str;
  ulong *local_1b8;
  long local_1b0;
  ulong local_1a8;
  long lStack_1a0;
  ulong *local_198;
  long local_190;
  ulong local_188;
  undefined8 uStack_180;
  uint local_174;
  ulong *local_170;
  long local_168;
  ulong local_160;
  undefined8 uStack_158;
  ulong *local_150;
  long local_148;
  ulong local_140;
  undefined8 uStack_138;
  undefined1 local_130 [32];
  ulong *local_110;
  long local_108;
  ulong local_100;
  undefined8 uStack_f8;
  long local_f0;
  SyncPointVk *local_e8;
  long *local_e0;
  undefined8 local_d8;
  long local_d0;
  undefined8 uStack_c8;
  VulkanRecycledSemaphore *local_c0;
  ulong *local_b8;
  uint local_b0;
  undefined4 uStack_ac;
  ulong local_a8 [2];
  ulong *local_98;
  uint local_90;
  undefined4 uStack_8c;
  ulong local_88 [2];
  ulong *local_78;
  uint local_70;
  undefined4 uStack_6c;
  ulong local_68 [2];
  ulong *local_58;
  long local_50;
  ulong local_48 [2];
  VkDevice local_38;
  
  (this->super_enable_shared_from_this<Diligent::SyncPointVk>)._M_weak_this.
  super___weak_ptr<Diligent::SyncPointVk,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_enable_shared_from_this<Diligent::SyncPointVk>)._M_weak_this.
  super___weak_ptr<Diligent::SyncPointVk,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->m_CommandQueueId).m_Value = CommandQueueId.m_Value;
  this->m_NumSemaphores = (Uint8)NumContexts;
  local_38 = LogicalDevice;
  VulkanUtilities::VulkanSyncObjectManager::CreateFence(&this->m_Fence,SyncObjectMngr);
  pSemaphores = this->m_Semaphores;
  *(undefined8 *)
   ((long)&this->m_Semaphores[0].m_pManager.
           super___shared_ptr<VulkanUtilities::VulkanSyncObjectManager,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi + 1) = 0;
  *(undefined8 *)((long)&this->m_Semaphores[0].m_VkSyncObject + 1) = 0;
  this->m_Semaphores[0].m_pManager.
  super___shared_ptr<VulkanUtilities::VulkanSyncObjectManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  this->m_Semaphores[0].m_pManager.
  super___shared_ptr<VulkanUtilities::VulkanSyncObjectManager,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_f0 = CONCAT44(local_f0._4_4_,(int)CONCAT71(in_register_00000031,CommandQueueId.m_Value));
  local_e8 = this;
  if ((this->m_CommandQueueId).m_Value != CommandQueueId.m_Value) {
    FormatString<char[45]>
              ((string *)local_130,(char (*) [45])"Not enough bits to store command queue index");
    DebugAssertionFailed
              ((Char *)local_130._0_8_,"SyncPointVk",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/CommandQueueVkImpl.cpp"
               ,0x5a);
    if ((undefined1 *)local_130._0_8_ != local_130 + 0x10) {
      operator_delete((void *)local_130._0_8_,local_130._16_8_ + 1);
    }
  }
  if (this->m_NumSemaphores != NumContexts) {
    FormatString<char[45]>
              ((string *)local_130,(char (*) [45])"Not enough bits to store command queue count");
    DebugAssertionFailed
              ((Char *)local_130._0_8_,"SyncPointVk",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/CommandQueueVkImpl.cpp"
               ,0x5b);
    if ((undefined1 *)local_130._0_8_ != local_130 + 0x10) {
      operator_delete((void *)local_130._0_8_,local_130._16_8_ + 1);
    }
  }
  if (1 < NumContexts) {
    lVar11 = 0;
    do {
      puVar4 = (undefined8 *)((long)this[1].m_Semaphores + lVar11 + -0x2f);
      *puVar4 = 0;
      puVar4[1] = 0;
      puVar4 = (undefined8 *)((long)this[1].m_Semaphores + lVar11 + -0x38);
      *puVar4 = 0;
      puVar4[1] = 0;
      lVar11 = lVar11 + 0x20;
    } while ((ulong)NumContexts * 0x20 + -0x20 != lVar11);
  }
  local_174 = (uint)(byte)local_f0;
  if (1 < NumContexts) {
    VulkanUtilities::VulkanSyncObjectManager::CreateSemaphores
              (SyncObjectMngr,pSemaphores,NumContexts - 1);
    uVar14 = (ulong)(local_174 << 5);
    local_130._0_8_ =
         *(undefined8 *)
          ((long)&(pSemaphores->m_pManager).
                  super___shared_ptr<VulkanUtilities::VulkanSyncObjectManager,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr + uVar14);
    local_130._8_8_ =
         *(size_type *)
          ((long)&this->m_Semaphores[0].m_pManager.
                  super___shared_ptr<VulkanUtilities::VulkanSyncObjectManager,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi + uVar14);
    *(undefined8 *)
     ((long)&this->m_Semaphores[0].m_pManager.
             super___shared_ptr<VulkanUtilities::VulkanSyncObjectManager,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi + uVar14) = 0;
    *(undefined8 *)
     ((long)&(pSemaphores->m_pManager).
             super___shared_ptr<VulkanUtilities::VulkanSyncObjectManager,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr + uVar14) = 0;
    local_130._16_8_ = *(size_type *)((long)&this->m_Semaphores[0].m_VkSyncObject + uVar14);
    local_130[0x18] = (&this->m_Semaphores[0].m_IsUnsignaled)[uVar14];
    *(undefined8 *)((long)&this->m_Semaphores[0].m_VkSyncObject + uVar14) = 0;
    VulkanUtilities::VulkanSyncObjectManager::RecycledSyncObject<VulkanUtilities::VkSemaphoreType>::
    operator=((RecycledSyncObject<VulkanUtilities::VkSemaphoreType> *)
              ((long)&(pSemaphores->m_pManager).
                      super___shared_ptr<VulkanUtilities::VulkanSyncObjectManager,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr + uVar14),pSemaphores + (NumContexts - 1));
    VulkanUtilities::VulkanSyncObjectManager::RecycledSyncObject<VulkanUtilities::VkSemaphoreType>::
    operator=(pSemaphores + (NumContexts - 1),
              (RecycledSyncObject<VulkanUtilities::VkSemaphoreType> *)local_130);
    VulkanUtilities::VulkanSyncObjectManager::RecycledSyncObject<VulkanUtilities::VkSemaphoreType>::
    ~RecycledSyncObject((RecycledSyncObject<VulkanUtilities::VkSemaphoreType> *)local_130);
  }
  local_150 = &local_140;
  local_c0 = pSemaphores;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"Queue (","");
  cVar13 = '\x01';
  if (9 < (byte)local_f0) {
    cVar13 = '\x03' - ((byte)local_f0 < 100);
  }
  local_1b8 = &local_1a8;
  std::__cxx11::string::_M_construct((ulong)&local_1b8,cVar13);
  std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_1b8,(uint)local_1b0,local_174);
  uVar14 = 0xf;
  if (local_150 != &local_140) {
    uVar14 = local_140;
  }
  if (uVar14 < (ulong)(local_1b0 + local_148)) {
    uVar14 = 0xf;
    if (local_1b8 != &local_1a8) {
      uVar14 = local_1a8;
    }
    if (uVar14 < (ulong)(local_1b0 + local_148)) goto LAB_001aa014;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_1b8,0,(char *)0x0,(ulong)local_150);
  }
  else {
LAB_001aa014:
    puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_150,(ulong)local_1b8);
  }
  local_110 = &local_100;
  puVar8 = puVar4 + 2;
  if ((ulong *)*puVar4 == puVar8) {
    local_100 = *puVar8;
    uStack_f8 = puVar4[3];
  }
  else {
    local_100 = *puVar8;
    local_110 = (ulong *)*puVar4;
  }
  local_108 = puVar4[1];
  *puVar4 = puVar8;
  puVar4[1] = 0;
  *(undefined1 *)puVar8 = 0;
  puVar4 = (undefined8 *)std::__cxx11::string::append((char *)&local_110);
  local_198 = &local_188;
  puVar8 = puVar4 + 2;
  if ((ulong *)*puVar4 == puVar8) {
    local_188 = *puVar8;
    uStack_180 = puVar4[3];
  }
  else {
    local_188 = *puVar8;
    local_198 = (ulong *)*puVar4;
  }
  local_190 = puVar4[1];
  *puVar4 = puVar8;
  puVar4[1] = 0;
  *(undefined1 *)(puVar4 + 2) = 0;
  cVar13 = '\x01';
  if (9 < dbgValue) {
    UVar10 = dbgValue;
    cVar3 = '\x04';
    do {
      cVar13 = cVar3;
      if (UVar10 < 100) {
        cVar13 = cVar13 + -2;
        goto LAB_001aa139;
      }
      if (UVar10 < 1000) {
        cVar13 = cVar13 + -1;
        goto LAB_001aa139;
      }
      if (UVar10 < 10000) goto LAB_001aa139;
      bVar2 = 99999 < UVar10;
      UVar10 = UVar10 / 10000;
      cVar3 = cVar13 + '\x04';
    } while (bVar2);
    cVar13 = cVar13 + '\x01';
  }
LAB_001aa139:
  local_170 = &local_160;
  std::__cxx11::string::_M_construct((ulong)&local_170,cVar13);
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_170,(uint)local_168,dbgValue);
  uVar14 = 0xf;
  if (local_198 != &local_188) {
    uVar14 = local_188;
  }
  if (uVar14 < (ulong)(local_168 + local_190)) {
    uVar14 = 0xf;
    if (local_170 != &local_160) {
      uVar14 = local_160;
    }
    if ((ulong)(local_168 + local_190) <= uVar14) {
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_170,0,(char *)0x0,(ulong)local_198);
      goto LAB_001aa1c2;
    }
  }
  puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_198,(ulong)local_170);
LAB_001aa1c2:
  local_e0 = &local_d0;
  plVar5 = puVar4 + 2;
  if ((long *)*puVar4 == plVar5) {
    local_d0 = *plVar5;
    uStack_c8 = puVar4[3];
  }
  else {
    local_d0 = *plVar5;
    local_e0 = (long *)*puVar4;
  }
  local_d8 = puVar4[1];
  *puVar4 = plVar5;
  puVar4[1] = 0;
  *(undefined1 *)plVar5 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_e0);
  local_130._0_8_ = local_130 + 0x10;
  psVar9 = (size_type *)(plVar5 + 2);
  if ((size_type *)*plVar5 == psVar9) {
    local_130._16_8_ = *psVar9;
    local_130._24_8_ = plVar5[3];
  }
  else {
    local_130._16_8_ = *psVar9;
    local_130._0_8_ = (size_type *)*plVar5;
  }
  local_130._8_8_ = plVar5[1];
  *plVar5 = (long)psVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  if (local_e0 != &local_d0) {
    operator_delete(local_e0,local_d0 + 1);
  }
  if (local_170 != &local_160) {
    operator_delete(local_170,local_160 + 1);
  }
  if (local_198 != &local_188) {
    operator_delete(local_198,local_188 + 1);
  }
  if (local_110 != &local_100) {
    operator_delete(local_110,local_100 + 1);
  }
  if (local_1b8 != &local_1a8) {
    operator_delete(local_1b8,local_1a8 + 1);
  }
  if (local_150 != &local_140) {
    operator_delete(local_150,local_140 + 1);
  }
  VulkanUtilities::SetFenceName(local_38,(this->m_Fence).m_VkSyncObject,(char *)local_130._0_8_);
  if (this->m_NumSemaphores != '\0') {
    bVar6 = (byte)local_f0;
    local_f0 = 1;
    if (9 < bVar6) {
      local_f0 = 3 - (ulong)(bVar6 < 100);
    }
    uVar14 = 0;
    do {
      if (local_c0[uVar14].m_VkSyncObject != (NativeType)0x0) {
        local_58 = local_48;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"Queue (","");
        local_78 = local_68;
        std::__cxx11::string::_M_construct((ulong)&local_78,(char)local_f0);
        std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_78,local_70,local_174);
        uVar12 = 0xf;
        if (local_58 != local_48) {
          uVar12 = local_48[0];
        }
        uVar1 = CONCAT44(uStack_6c,local_70) + local_50;
        if (uVar12 < uVar1) {
          uVar12 = 0xf;
          if (local_78 != local_68) {
            uVar12 = local_68[0];
          }
          if (uVar12 < uVar1) goto LAB_001aa45b;
          puVar4 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_78,0,(char *)0x0,(ulong)local_58);
        }
        else {
LAB_001aa45b:
          puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_58,(ulong)local_78);
        }
        local_170 = &local_160;
        puVar8 = puVar4 + 2;
        if ((ulong *)*puVar4 == puVar8) {
          local_160 = *puVar8;
          uStack_158 = puVar4[3];
        }
        else {
          local_160 = *puVar8;
          local_170 = (ulong *)*puVar4;
        }
        local_168 = puVar4[1];
        *puVar4 = puVar8;
        puVar4[1] = 0;
        *(undefined1 *)puVar8 = 0;
        plVar5 = (long *)std::__cxx11::string::append((char *)&local_170);
        local_1b8 = &local_1a8;
        puVar8 = (ulong *)(plVar5 + 2);
        if ((ulong *)*plVar5 == puVar8) {
          local_1a8 = *puVar8;
          lStack_1a0 = plVar5[3];
        }
        else {
          local_1a8 = *puVar8;
          local_1b8 = (ulong *)*plVar5;
        }
        local_1b0 = plVar5[1];
        *plVar5 = (long)puVar8;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        cVar13 = '\x01';
        if (9 < dbgValue) {
          UVar10 = dbgValue;
          cVar3 = '\x04';
          do {
            cVar13 = cVar3;
            if (UVar10 < 100) {
              cVar13 = cVar13 + -2;
              goto LAB_001aa572;
            }
            if (UVar10 < 1000) {
              cVar13 = cVar13 + -1;
              goto LAB_001aa572;
            }
            if (UVar10 < 10000) goto LAB_001aa572;
            bVar2 = 99999 < UVar10;
            UVar10 = UVar10 / 10000;
            cVar3 = cVar13 + '\x04';
          } while (bVar2);
          cVar13 = cVar13 + '\x01';
        }
LAB_001aa572:
        local_98 = local_88;
        std::__cxx11::string::_M_construct((ulong)&local_98,cVar13);
        std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_98,local_90,dbgValue);
        uVar12 = 0xf;
        if (local_1b8 != &local_1a8) {
          uVar12 = local_1a8;
        }
        uVar1 = CONCAT44(uStack_8c,local_90) + local_1b0;
        if (uVar12 < uVar1) {
          uVar12 = 0xf;
          if (local_98 != local_88) {
            uVar12 = local_88[0];
          }
          if (uVar12 < uVar1) goto LAB_001aa5fd;
          puVar4 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_98,0,(char *)0x0,(ulong)local_1b8);
        }
        else {
LAB_001aa5fd:
          puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1b8,(ulong)local_98)
          ;
        }
        local_150 = &local_140;
        puVar8 = puVar4 + 2;
        if ((ulong *)*puVar4 == puVar8) {
          local_140 = *puVar8;
          uStack_138 = puVar4[3];
        }
        else {
          local_140 = *puVar8;
          local_150 = (ulong *)*puVar4;
        }
        local_148 = puVar4[1];
        *puVar4 = puVar8;
        puVar4[1] = 0;
        *(undefined1 *)puVar8 = 0;
        puVar4 = (undefined8 *)std::__cxx11::string::append((char *)&local_150);
        puVar8 = puVar4 + 2;
        if ((ulong *)*puVar4 == puVar8) {
          local_100 = *puVar8;
          uStack_f8 = puVar4[3];
          local_110 = &local_100;
        }
        else {
          local_100 = *puVar8;
          local_110 = (ulong *)*puVar4;
        }
        local_108 = puVar4[1];
        *puVar4 = puVar8;
        puVar4[1] = 0;
        *(undefined1 *)(puVar4 + 2) = 0;
        cVar13 = '\x01';
        if (9 < uVar14) {
          uVar12 = uVar14;
          cVar3 = '\x04';
          do {
            cVar13 = cVar3;
            uVar7 = (uint)uVar12;
            if (uVar7 < 100) {
              cVar13 = cVar13 + -2;
              goto LAB_001aa71d;
            }
            if (uVar7 < 1000) {
              cVar13 = cVar13 + -1;
              goto LAB_001aa71d;
            }
            if (uVar7 < 10000) goto LAB_001aa71d;
            uVar12 = (uVar12 & 0xffffffff) / 10000;
            cVar3 = cVar13 + '\x04';
          } while (99999 < uVar7);
          cVar13 = cVar13 + '\x01';
        }
LAB_001aa71d:
        local_b8 = local_a8;
        std::__cxx11::string::_M_construct((ulong)&local_b8,cVar13);
        std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_b8,local_b0,(uint)uVar14);
        uVar12 = 0xf;
        if (local_110 != &local_100) {
          uVar12 = local_100;
        }
        uVar1 = CONCAT44(uStack_ac,local_b0) + local_108;
        if (uVar12 < uVar1) {
          uVar12 = 0xf;
          if (local_b8 != local_a8) {
            uVar12 = local_a8[0];
          }
          if (uVar12 < uVar1) goto LAB_001aa7ac;
          puVar4 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_b8,0,(char *)0x0,(ulong)local_110);
        }
        else {
LAB_001aa7ac:
          puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_110,(ulong)local_b8)
          ;
        }
        local_198 = &local_188;
        puVar8 = puVar4 + 2;
        if ((ulong *)*puVar4 == puVar8) {
          local_188 = *puVar8;
          uStack_180 = puVar4[3];
        }
        else {
          local_188 = *puVar8;
          local_198 = (ulong *)*puVar4;
        }
        local_190 = puVar4[1];
        *puVar4 = puVar8;
        puVar4[1] = 0;
        *(undefined1 *)puVar8 = 0;
        puVar4 = (undefined8 *)std::__cxx11::string::append((char *)&local_198);
        plVar5 = puVar4 + 2;
        if ((long *)*puVar4 == plVar5) {
          local_d0 = *plVar5;
          uStack_c8 = puVar4[3];
          local_e0 = &local_d0;
        }
        else {
          local_d0 = *plVar5;
          local_e0 = (long *)*puVar4;
        }
        local_d8 = puVar4[1];
        *puVar4 = plVar5;
        puVar4[1] = 0;
        *(undefined1 *)(puVar4 + 2) = 0;
        std::__cxx11::string::operator=((string *)local_130,(string *)&local_e0);
        if (local_e0 != &local_d0) {
          operator_delete(local_e0,local_d0 + 1);
        }
        if (local_198 != &local_188) {
          operator_delete(local_198,local_188 + 1);
        }
        if (local_b8 != local_a8) {
          operator_delete(local_b8,local_a8[0] + 1);
        }
        if (local_110 != &local_100) {
          operator_delete(local_110,local_100 + 1);
        }
        if (local_150 != &local_140) {
          operator_delete(local_150,local_140 + 1);
        }
        if (local_98 != local_88) {
          operator_delete(local_98,local_88[0] + 1);
        }
        if (local_1b8 != &local_1a8) {
          operator_delete(local_1b8,local_1a8 + 1);
        }
        if (local_170 != &local_160) {
          operator_delete(local_170,local_160 + 1);
        }
        if (local_78 != local_68) {
          operator_delete(local_78,local_68[0] + 1);
        }
        if (local_58 != local_48) {
          operator_delete(local_58,local_48[0] + 1);
        }
        VulkanUtilities::SetSemaphoreName
                  (local_38,local_c0[uVar14].m_VkSyncObject,(char *)local_130._0_8_);
      }
      uVar14 = uVar14 + 1;
    } while (uVar14 < local_e8->m_NumSemaphores);
  }
  if ((undefined1 *)local_130._0_8_ != local_130 + 0x10) {
    operator_delete((void *)local_130._0_8_,local_130._16_8_ + 1);
  }
  return;
}

Assistant:

SyncPointVk::SyncPointVk(SoftwareQueueIndex                        CommandQueueId,
                         Uint32                                    NumContexts,
                         VulkanUtilities::VulkanSyncObjectManager& SyncObjectMngr,
                         VkDevice                                  LogicalDevice,
                         Uint64                                    dbgValue) :
    m_CommandQueueId{CommandQueueId},
    m_NumSemaphores{static_cast<Uint8>(NumContexts)},
    m_Fence{SyncObjectMngr.CreateFence()}
{
    VERIFY(m_CommandQueueId == CommandQueueId, "Not enough bits to store command queue index");
    VERIFY(m_NumSemaphores == NumContexts, "Not enough bits to store command queue count");

    // Call constructors for semaphores
    for (Uint32 s = _countof(m_Semaphores); s < NumContexts; ++s)
        new (&m_Semaphores[s]) VulkanUtilities::VulkanRecycledSemaphore{};

    // Semaphores are used to synchronize between queues; they are not used for synchronization within one queue.
    if (NumContexts > 1)
    {
        SyncObjectMngr.CreateSemaphores(m_Semaphores, NumContexts - 1);

        // Semaphore for the current queue is not used.
        std::swap(m_Semaphores[CommandQueueId], m_Semaphores[NumContexts - 1]);
    }

#ifdef DILIGENT_DEBUG
    String Name = String{"Queue ("} + std::to_string(CommandQueueId) + ") Value (" + std::to_string(dbgValue) + ")";
    VulkanUtilities::SetFenceName(LogicalDevice, m_Fence, Name.c_str());

    for (Uint32 s = 0; s < m_NumSemaphores; ++s)
    {
        if (m_Semaphores[s])
        {
            Name = String{"Queue ("} + std::to_string(CommandQueueId) + ") Value (" + std::to_string(dbgValue) + ") Ctx (" + std::to_string(s) + ")";
            VulkanUtilities::SetSemaphoreName(LogicalDevice, m_Semaphores[s], Name.c_str());
        }
    }
#endif
}